

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KcpWithTcpServer.cpp
# Opt level: O2

void __thiscall
sznet::net::KcpWithTcpServer::removeConnectionInLoop(KcpWithTcpServer *this,TcpConnectionPtr *conn)

{
  self *psVar1;
  size_type sVar2;
  KcpTcpEventLoop *this_00;
  SourceFile file;
  undefined1 local_1038 [4048];
  undefined1 local_68 [12];
  code *local_58;
  undefined8 local_50;
  KcpTcpEventLoop *local_48;
  KcpTcpEventLoop *ioLoop;
  
  EventLoop::assertInLoopThread(&this->m_loop->super_EventLoop);
  if (g_logLevel < 3) {
    Logger::SourceFile::SourceFile<107>
              ((SourceFile *)local_68,
               (char (*) [107])
               "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/KcpWithTcpServer.cpp"
              );
    file._12_4_ = 0;
    file.m_data = (char *)local_68._0_8_;
    file.m_size = local_68._8_4_;
    Logger::Logger((Logger *)local_1038,file,0x5f);
    psVar1 = LogStream::operator<<
                       ((LogStream *)(local_1038 + 8),"KcpWithTcpServer::removeConnectionInLoop [");
    psVar1 = LogStream::operator<<(psVar1,&this->m_name);
    psVar1 = LogStream::operator<<(psVar1,"] - connection ");
    psVar1 = LogStream::operator<<
                       (psVar1,&((conn->
                                 super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>
                                 )._M_ptr)->m_name);
    psVar1 = LogStream::operator<<(psVar1," - ");
    LogStream::operator<<
              (psVar1,((conn->
                       super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr)->m_id);
    Logger::~Logger((Logger *)local_1038);
  }
  local_1038._0_4_ =
       ((conn->super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
       m_id;
  sVar2 = std::
          _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::shared_ptr<sznet::net::TcpConnection>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::shared_ptr<sznet::net::TcpConnection>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<sznet::net::TcpConnection>_>_>_>
          ::erase(&(this->m_connections)._M_t,(key_type *)local_1038);
  if (sVar2 == 1) {
    this_00 = down_cast<sznet::net::KcpTcpEventLoop*,sznet::net::EventLoop>
                        (((conn->
                          super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>)
                         ._M_ptr)->m_loop);
    local_58 = KcpTcpEventLoop::removeTcpConnectionInLoop;
    local_50 = 0;
    local_48 = this_00;
    std::
    _Bind<void(sznet::net::KcpTcpEventLoop::*(sznet::net::KcpTcpEventLoop*,std::shared_ptr<sznet::net::TcpConnection>))(std::shared_ptr<sznet::net::TcpConnection>const&)>
    ::_Bind<sznet::net::KcpTcpEventLoop*&,std::shared_ptr<sznet::net::TcpConnection>const&>
              ((_Bind<void(sznet::net::KcpTcpEventLoop::*(sznet::net::KcpTcpEventLoop*,std::shared_ptr<sznet::net::TcpConnection>))(std::shared_ptr<sznet::net::TcpConnection>const&)>
                *)local_1038,(offset_in_KcpTcpEventLoop_to_subr *)&local_58,&local_48,conn);
    std::function<void()>::
    function<std::_Bind<void(sznet::net::KcpTcpEventLoop::*(sznet::net::KcpTcpEventLoop*,std::shared_ptr<sznet::net::TcpConnection>))(std::shared_ptr<sznet::net::TcpConnection>const&)>,void>
              ((function<void()> *)&ioLoop,
               (_Bind<void_(sznet::net::KcpTcpEventLoop::*(sznet::net::KcpTcpEventLoop_*,_std::shared_ptr<sznet::net::TcpConnection>))(const_std::shared_ptr<sznet::net::TcpConnection>_&)>
                *)local_1038);
    EventLoop::queueInLoop(&this_00->super_EventLoop,(Functor *)&ioLoop);
    std::_Function_base::~_Function_base((_Function_base *)&ioLoop);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1038 + 0x18));
    return;
  }
  __assert_fail("n == 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/KcpWithTcpServer.cpp"
                ,99,
                "void sznet::net::KcpWithTcpServer::removeConnectionInLoop(const TcpConnectionPtr &)"
               );
}

Assistant:

void KcpWithTcpServer::removeConnectionInLoop(const TcpConnectionPtr& conn)
{
	m_loop->assertInLoopThread();
	LOG_INFO << "KcpWithTcpServer::removeConnectionInLoop [" << m_name
		<< "] - connection " << conn->name() << " - " << conn->id();
	size_t n = m_connections.erase(conn->id());
	(void)n;
	assert(n == 1);
	KcpTcpEventLoop* ioLoop = down_cast<KcpTcpEventLoop*>(conn->getLoop());
	ioLoop->queueInLoop(std::bind(&KcpTcpEventLoop::removeTcpConnectionInLoop, ioLoop, conn));
}